

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool __thiscall CKey::VerifyPubKey(CKey *this,CPubKey *pubkey)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 hash;
  string str;
  uchar rnd [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fCompressed == ((pubkey->vch[0] & 0xfe) == 2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"Bitcoin key verification\n",(allocator<char> *)&hash);
    bytes.m_size = 8;
    bytes.m_data = rnd;
    GetRandBytes(bytes);
    Hash<std::__cxx11::string,unsigned_char[8]>(&hash,&str,&rnd);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Sign(this,&hash,&vchSig,true,0);
    bVar2 = CPubKey::Verify(pubkey,&hash,&vchSig);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&str);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::VerifyPubKey(const CPubKey& pubkey) const {
    if (pubkey.IsCompressed() != fCompressed) {
        return false;
    }
    unsigned char rnd[8];
    std::string str = "Bitcoin key verification\n";
    GetRandBytes(rnd);
    uint256 hash{Hash(str, rnd)};
    std::vector<unsigned char> vchSig;
    Sign(hash, vchSig);
    return pubkey.Verify(hash, vchSig);
}